

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FileEnumerator.cpp
# Opt level: O1

String * __thiscall
axl::io::FileEnumerator::getNextFileName(String *__return_storage_ptr__,FileEnumerator *this)

{
  String *this_00;
  BufHdr *pBVar1;
  int iVar2;
  dirent *dirEntryPtr;
  dirent dirEntry;
  dirent *local_138;
  dirent local_130;
  
  if ((this->super_FileEnumeratorHandle).m_h == (__dirstream *)0x0) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_hdr + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_length + 1) = 0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
         (C *)0x0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
         (BufHdr *)0x0;
  }
  else {
    this_00 = &this->m_nextFileName;
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (__return_storage_ptr__,this_00);
    iVar2 = readdir_r((DIR *)(this->super_FileEnumeratorHandle).m_h,&local_130,&local_138);
    if (local_138 == (dirent *)0x0 || iVar2 != 0) {
      pBVar1 = (this->m_nextFileName).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
               m_hdr;
      if (pBVar1 != (BufHdr *)0x0) {
        if ((pBVar1->super_RefCount).m_refCount == 1) {
          (this->m_nextFileName).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
               (C *)(pBVar1 + 1);
          *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
          (this->m_nextFileName).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
          m_length = 0;
        }
        else {
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                    (&this_00->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        }
      }
    }
    else {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                (this_00,(EVP_PKEY_CTX *)local_138->d_name,(EVP_PKEY_CTX *)0xffffffffffffffff);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sl::String
FileEnumerator::getNextFileName() {
	if (!isOpen())
		return sl::String();

	sl::String fileName = m_nextFileName;

	dirent dirEntry;
	dirent* dirEntryPtr;
	int result = readdir_r(m_h, &dirEntry, &dirEntryPtr);

	if (result == 0 && dirEntryPtr)
		m_nextFileName = dirEntryPtr->d_name;
	else
		m_nextFileName.clear();

	return fileName;
}